

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

void Abc_NtkPermute(Abc_Ntk_t *pNtk,int fInputs,int fOutputs,int fFlops,char *pFlopPermFile)

{
  Vec_Ptr_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  void *pvVar8;
  void *pvVar9;
  Vec_Int_t *p;
  Vec_Int_t *pVVar10;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vTemp;
  Vec_Int_t *vFlops;
  Vec_Int_t *vOutputs;
  Vec_Int_t *vInputs;
  Abc_Obj_t *pTemp;
  char *pFlopPermFile_local;
  int local_18;
  int fFlops_local;
  int fOutputs_local;
  int fInputs_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pFlopPermFile == (char *)0x0) {
    iVar3 = Abc_NtkLatchNum(pNtk);
    vTemp = Vec_IntStartNatural(iVar3);
    pFlopPermFile_local._4_4_ = fFlops;
    local_18 = fOutputs;
    fFlops_local = fInputs;
  }
  else {
    iVar3 = Abc_NtkLatchNum(pNtk);
    vTemp = Abc_NtkReadFlopPerm(pFlopPermFile,iVar3);
    if (vTemp == (Vec_Int_t *)0x0) {
      return;
    }
    fFlops_local = 0;
    local_18 = 0;
    pFlopPermFile_local._4_4_ = 0;
  }
  iVar3 = Abc_NtkPiNum(pNtk);
  pVVar6 = Vec_IntStartNatural(iVar3);
  iVar3 = Abc_NtkPoNum(pNtk);
  pVVar7 = Vec_IntStartNatural(iVar3);
  if (fFlops_local != 0) {
    for (Entry = 0; iVar3 = Abc_NtkPiNum(pNtk), Entry < iVar3; Entry = Entry + 1) {
      iVar3 = rand();
      iVar4 = Abc_NtkPiNum(pNtk);
      iVar3 = iVar3 % iVar4;
      iVar4 = Vec_IntEntry(pVVar6,Entry);
      iVar5 = Vec_IntEntry(pVVar6,iVar3);
      Vec_IntWriteEntry(pVVar6,Entry,iVar5);
      Vec_IntWriteEntry(pVVar6,iVar3,iVar4);
      pvVar8 = Vec_PtrEntry(pNtk->vPis,Entry);
      pVVar1 = pNtk->vPis;
      pvVar9 = Vec_PtrEntry(pNtk->vPis,iVar3);
      Vec_PtrWriteEntry(pVVar1,Entry,pvVar9);
      Vec_PtrWriteEntry(pNtk->vPis,iVar3,pvVar8);
      pvVar8 = Vec_PtrEntry(pNtk->vCis,Entry);
      pVVar1 = pNtk->vCis;
      pvVar9 = Vec_PtrEntry(pNtk->vCis,iVar3);
      Vec_PtrWriteEntry(pVVar1,Entry,pvVar9);
      Vec_PtrWriteEntry(pNtk->vCis,iVar3,pvVar8);
    }
  }
  if (local_18 != 0) {
    for (Entry = 0; iVar3 = Abc_NtkPoNum(pNtk), Entry < iVar3; Entry = Entry + 1) {
      iVar3 = rand();
      iVar4 = Abc_NtkPoNum(pNtk);
      iVar3 = iVar3 % iVar4;
      iVar4 = Vec_IntEntry(pVVar7,Entry);
      iVar5 = Vec_IntEntry(pVVar7,iVar3);
      Vec_IntWriteEntry(pVVar7,Entry,iVar5);
      Vec_IntWriteEntry(pVVar7,iVar3,iVar4);
      pvVar8 = Vec_PtrEntry(pNtk->vPos,Entry);
      pVVar1 = pNtk->vPos;
      pvVar9 = Vec_PtrEntry(pNtk->vPos,iVar3);
      Vec_PtrWriteEntry(pVVar1,Entry,pvVar9);
      Vec_PtrWriteEntry(pNtk->vPos,iVar3,pvVar8);
      pvVar8 = Vec_PtrEntry(pNtk->vCos,Entry);
      pVVar1 = pNtk->vCos;
      pvVar9 = Vec_PtrEntry(pNtk->vCos,iVar3);
      Vec_PtrWriteEntry(pVVar1,Entry,pvVar9);
      Vec_PtrWriteEntry(pNtk->vCos,iVar3,pvVar8);
    }
  }
  iVar3 = Abc_NtkBoxNum(pNtk);
  iVar4 = Abc_NtkLatchNum(pNtk);
  if (iVar3 == iVar4) {
    if (pFlopPermFile_local._4_4_ != 0) {
      for (Entry = 0; iVar3 = Abc_NtkLatchNum(pNtk), Entry < iVar3; Entry = Entry + 1) {
        iVar3 = rand();
        iVar4 = Abc_NtkLatchNum(pNtk);
        iVar3 = iVar3 % iVar4;
        iVar4 = Vec_IntEntry(vTemp,Entry);
        iVar5 = Vec_IntEntry(vTemp,iVar3);
        Vec_IntWriteEntry(vTemp,Entry,iVar5);
        Vec_IntWriteEntry(vTemp,iVar3,iVar4);
        pvVar8 = Vec_PtrEntry(pNtk->vBoxes,Entry);
        pVVar1 = pNtk->vBoxes;
        pvVar9 = Vec_PtrEntry(pNtk->vBoxes,iVar3);
        Vec_PtrWriteEntry(pVVar1,Entry,pvVar9);
        Vec_PtrWriteEntry(pNtk->vBoxes,iVar3,pvVar8);
        pVVar1 = pNtk->vCis;
        iVar4 = Abc_NtkPiNum(pNtk);
        pvVar8 = Vec_PtrEntry(pVVar1,iVar4 + Entry);
        pVVar1 = pNtk->vCis;
        iVar4 = Abc_NtkPiNum(pNtk);
        pVVar2 = pNtk->vCis;
        iVar5 = Abc_NtkPiNum(pNtk);
        pvVar9 = Vec_PtrEntry(pVVar2,iVar5 + iVar3);
        Vec_PtrWriteEntry(pVVar1,iVar4 + Entry,pvVar9);
        pVVar1 = pNtk->vCis;
        iVar4 = Abc_NtkPiNum(pNtk);
        Vec_PtrWriteEntry(pVVar1,iVar4 + iVar3,pvVar8);
        pVVar1 = pNtk->vCos;
        iVar4 = Abc_NtkPoNum(pNtk);
        pvVar8 = Vec_PtrEntry(pVVar1,iVar4 + Entry);
        pVVar1 = pNtk->vCos;
        iVar4 = Abc_NtkPoNum(pNtk);
        pVVar2 = pNtk->vCos;
        iVar5 = Abc_NtkPoNum(pNtk);
        pvVar9 = Vec_PtrEntry(pVVar2,iVar5 + iVar3);
        Vec_PtrWriteEntry(pVVar1,iVar4 + Entry,pvVar9);
        pVVar1 = pNtk->vCos;
        iVar4 = Abc_NtkPoNum(pNtk);
        Vec_PtrWriteEntry(pVVar1,iVar4 + iVar3,pvVar8);
      }
    }
    p = Vec_IntInvert(pVVar6,-1);
    Vec_IntFree(pVVar6);
    pVVar6 = Vec_IntInvert(pVVar7,-1);
    Vec_IntFree(pVVar7);
    pVVar7 = Vec_IntInvert(vTemp,-1);
    Vec_IntFree(vTemp);
    Vec_IntFreeP(&pNtk->vObjPerm);
    iVar3 = Abc_NtkPiNum(pNtk);
    iVar4 = Abc_NtkPoNum(pNtk);
    iVar5 = Abc_NtkLatchNum(pNtk);
    pVVar10 = Vec_IntAlloc(iVar3 + iVar4 + iVar5);
    pNtk->vObjPerm = pVVar10;
    for (Entry = 0; iVar3 = Vec_IntSize(p), Entry < iVar3; Entry = Entry + 1) {
      iVar3 = Vec_IntEntry(p,Entry);
      Vec_IntPush(pNtk->vObjPerm,iVar3);
    }
    for (Entry = 0; iVar3 = Vec_IntSize(pVVar6), Entry < iVar3; Entry = Entry + 1) {
      iVar3 = Vec_IntEntry(pVVar6,Entry);
      Vec_IntPush(pNtk->vObjPerm,iVar3);
    }
    for (Entry = 0; iVar3 = Vec_IntSize(pVVar7), Entry < iVar3; Entry = Entry + 1) {
      iVar3 = Vec_IntEntry(pVVar7,Entry);
      Vec_IntPush(pNtk->vObjPerm,iVar3);
    }
    Vec_IntFree(p);
    Vec_IntFree(pVVar6);
    Vec_IntFree(pVVar7);
    return;
  }
  __assert_fail("Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                ,0x7e4,"void Abc_NtkPermute(Abc_Ntk_t *, int, int, int, char *)");
}

Assistant:

void Abc_NtkPermute( Abc_Ntk_t * pNtk, int fInputs, int fOutputs, int fFlops, char * pFlopPermFile )
{
    Abc_Obj_t * pTemp;
    Vec_Int_t * vInputs, * vOutputs, * vFlops, * vTemp;
    int i, k, Entry;
    // start permutation arrays
    if ( pFlopPermFile )
    {
        vFlops = Abc_NtkReadFlopPerm( pFlopPermFile, Abc_NtkLatchNum(pNtk) );
        if ( vFlops == NULL )
            return;
        fInputs  = 0;
        fOutputs = 0;
        fFlops   = 0;
    }
    else
        vFlops   = Vec_IntStartNatural( Abc_NtkLatchNum(pNtk) );
    vInputs  = Vec_IntStartNatural( Abc_NtkPiNum(pNtk) );
    vOutputs = Vec_IntStartNatural( Abc_NtkPoNum(pNtk) );
    // permute inputs
    if ( fInputs )
    for ( i = 0; i < Abc_NtkPiNum(pNtk); i++ )
    {
        k = rand() % Abc_NtkPiNum(pNtk);
        // swap indexes
        Entry = Vec_IntEntry( vInputs, i );
        Vec_IntWriteEntry( vInputs, i, Vec_IntEntry(vInputs, k) );
        Vec_IntWriteEntry( vInputs, k, Entry );
        // swap PIs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vPis, i );
        Vec_PtrWriteEntry( pNtk->vPis, i, Vec_PtrEntry(pNtk->vPis, k) );
        Vec_PtrWriteEntry( pNtk->vPis, k, pTemp );
        // swap CIs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCis, i );
        Vec_PtrWriteEntry( pNtk->vCis, i, Vec_PtrEntry(pNtk->vCis, k) );
        Vec_PtrWriteEntry( pNtk->vCis, k, pTemp );
//printf( "Swapping PIs %d and %d.\n", i, k );
    }
    // permute outputs
    if ( fOutputs )
    for ( i = 0; i < Abc_NtkPoNum(pNtk); i++ )
    {
        k = rand() % Abc_NtkPoNum(pNtk);
        // swap indexes
        Entry = Vec_IntEntry( vOutputs, i );
        Vec_IntWriteEntry( vOutputs, i, Vec_IntEntry(vOutputs, k) );
        Vec_IntWriteEntry( vOutputs, k, Entry );
        // swap POs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vPos, i );
        Vec_PtrWriteEntry( pNtk->vPos, i, Vec_PtrEntry(pNtk->vPos, k) );
        Vec_PtrWriteEntry( pNtk->vPos, k, pTemp );
        // swap COs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCos, i );
        Vec_PtrWriteEntry( pNtk->vCos, i, Vec_PtrEntry(pNtk->vCos, k) );
        Vec_PtrWriteEntry( pNtk->vCos, k, pTemp );
//printf( "Swapping POs %d and %d.\n", i, k );
    }
    // permute flops
    assert( Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk) );
    if ( fFlops )
    for ( i = 0; i < Abc_NtkLatchNum(pNtk); i++ )
    {
        k = rand() % Abc_NtkLatchNum(pNtk);
        // swap indexes
        Entry = Vec_IntEntry( vFlops, i );
        Vec_IntWriteEntry( vFlops, i, Vec_IntEntry(vFlops, k) );
        Vec_IntWriteEntry( vFlops, k, Entry );
        // swap flops
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vBoxes, i );
        Vec_PtrWriteEntry( pNtk->vBoxes, i, Vec_PtrEntry(pNtk->vBoxes, k) );
        Vec_PtrWriteEntry( pNtk->vBoxes, k, pTemp );
        // swap CIs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCis, Abc_NtkPiNum(pNtk)+i );
        Vec_PtrWriteEntry( pNtk->vCis, Abc_NtkPiNum(pNtk)+i, Vec_PtrEntry(pNtk->vCis, Abc_NtkPiNum(pNtk)+k) );
        Vec_PtrWriteEntry( pNtk->vCis, Abc_NtkPiNum(pNtk)+k, pTemp );
        // swap COs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCos, Abc_NtkPoNum(pNtk)+i );
        Vec_PtrWriteEntry( pNtk->vCos, Abc_NtkPoNum(pNtk)+i, Vec_PtrEntry(pNtk->vCos, Abc_NtkPoNum(pNtk)+k) );
        Vec_PtrWriteEntry( pNtk->vCos, Abc_NtkPoNum(pNtk)+k, pTemp );

//printf( "Swapping flops %d and %d.\n", i, k );
    }
    // invert arrays
    vInputs = Vec_IntInvert( vTemp = vInputs, -1 );
    Vec_IntFree( vTemp );
    vOutputs = Vec_IntInvert( vTemp = vOutputs, -1 );
    Vec_IntFree( vTemp );
    vFlops = Vec_IntInvert( vTemp = vFlops, -1 );
    Vec_IntFree( vTemp );
    // pack the results into the output array
    Vec_IntFreeP( &pNtk->vObjPerm );
    pNtk->vObjPerm = Vec_IntAlloc( Abc_NtkPiNum(pNtk) + Abc_NtkPoNum(pNtk) + Abc_NtkLatchNum(pNtk) );
    Vec_IntForEachEntry( vInputs, Entry, i )
        Vec_IntPush( pNtk->vObjPerm, Entry );
    Vec_IntForEachEntry( vOutputs, Entry, i )
        Vec_IntPush( pNtk->vObjPerm, Entry );
    Vec_IntForEachEntry( vFlops, Entry, i )
        Vec_IntPush( pNtk->vObjPerm, Entry );
    // cleanup
    Vec_IntFree( vInputs );
    Vec_IntFree( vOutputs );
    Vec_IntFree( vFlops );
}